

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_cluster_on_fail(intptr_t uuid,void *udata)

{
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: (facil.io) unknown cluster connection error");
  }
  perror("       errno");
  kill(fio_data->parent,2);
  if (fio_data != (fio_data_s *)0x0) {
    fio_data->active = '\0';
  }
  return;
}

Assistant:

static void fio_cluster_on_fail(intptr_t uuid, void *udata) {
  FIO_LOG_FATAL("(facil.io) unknown cluster connection error");
  perror("       errno");
  kill(fio_parent_pid(), SIGINT);
  fio_stop();
  // exit(errno ? errno : 1);
  (void)udata;
  (void)uuid;
}